

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-pause.c
# Opt level: O0

void cw_pause_close(Curl_easy *data,Curl_cwriter *writer)

{
  cw_pause_ctx *ctx;
  Curl_cwriter *writer_local;
  Curl_easy *data_local;
  
  cw_pause_bufs_free((cw_pause_ctx *)writer->ctx);
  return;
}

Assistant:

static void cw_pause_close(struct Curl_easy *data, struct Curl_cwriter *writer)
{
  struct cw_pause_ctx *ctx = writer->ctx;

  (void)data;
  cw_pause_bufs_free(ctx);
}